

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int MRIStepSetCoupling(void *arkode_mem,MRIStepCoupling MRIC)

{
  int iVar1;
  MRIStepCoupling MRIC_00;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Tliw;
  sunindextype Tlrw;
  
  iVar1 = mriStep_AccessARKODEStepMem(arkode_mem,"MRIStepSetCoupling",&ark_mem,&step_mem);
  if (iVar1 == 0) {
    if (MRIC == (MRIStepCoupling)0x0) {
      arkProcessError(ark_mem,-0x15,0x32,"MRIStepSetCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                      ,"The MRIStepCoupling is NULL.");
      iVar1 = -0x16;
    }
    else {
      step_mem->stages = 0;
      step_mem->q = 0;
      step_mem->p = 0;
      MRIStepCoupling_Space(step_mem->MRIC,&Tliw,&Tlrw);
      MRIStepCoupling_Free(step_mem->MRIC);
      step_mem->MRIC = (MRIStepCoupling)0x0;
      ark_mem->liw = ark_mem->liw - Tliw;
      ark_mem->lrw = ark_mem->lrw - Tlrw;
      step_mem->stages = MRIC->stages;
      iVar1 = MRIC->p;
      step_mem->q = MRIC->q;
      step_mem->p = iVar1;
      MRIC_00 = MRIStepCoupling_Copy(MRIC);
      step_mem->MRIC = MRIC_00;
      if (MRIC_00 == (MRIStepCoupling)0x0) {
        iVar1 = -0x15;
        arkProcessError(ark_mem,-0x15,0x4a,"MRIStepSetCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep_io.c"
                        ,"The MRIStepCoupling is NULL.");
      }
      else {
        MRIStepCoupling_Space(MRIC_00,&Tliw,&Tlrw);
        ark_mem->liw = ark_mem->liw + Tliw;
        ark_mem->lrw = ark_mem->lrw + Tlrw;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int MRIStepSetCoupling(void* arkode_mem, MRIStepCoupling MRIC)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  sunindextype Tlrw, Tliw;

  /* access ARKodeMem and ARKodeMRIStepMem structures */
  retval = mriStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* check for illegal inputs */
  if (MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_COUPLING);
    return (ARK_ILL_INPUT);
  }

  /* clear any existing parameters and coupling structure */
  step_mem->stages = 0;
  step_mem->q      = 0;
  step_mem->p      = 0;
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  MRIStepCoupling_Free(step_mem->MRIC);
  step_mem->MRIC = NULL;
  ark_mem->liw -= Tliw;
  ark_mem->lrw -= Tlrw;

  /* set the relevant parameters */
  step_mem->stages = MRIC->stages;
  step_mem->q      = MRIC->q;
  step_mem->p      = MRIC->p;

  /* copy the coupling structure in step memory */
  step_mem->MRIC = MRIStepCoupling_Copy(MRIC);
  if (step_mem->MRIC == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_COUPLING);
    return (ARK_MEM_NULL);
  }
  MRIStepCoupling_Space(step_mem->MRIC, &Tliw, &Tlrw);
  ark_mem->liw += Tliw;
  ark_mem->lrw += Tlrw;

  return (ARK_SUCCESS);
}